

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  pointer *this_00;
  cmCTest *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  ostream *poVar6;
  reference pbVar7;
  char *dir_00;
  void *pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  iterator __first;
  iterator __last;
  ulong uVar10;
  mapped_type *this_01;
  reference pvVar11;
  long lVar12;
  size_type sVar13;
  string local_3360 [32];
  undefined1 local_3340 [8];
  ostringstream cmCTestLog_msg_25;
  string local_31c8 [32];
  undefined1 local_31a8 [8];
  ostringstream cmCTestLog_msg_24;
  value_type_conflict2 local_3030;
  int local_302c;
  string local_3028 [4];
  int lineIdx;
  string lineNumber;
  string local_3000 [4];
  int cov;
  string prefix;
  undefined1 local_2fc0 [8];
  ostringstream cmCTestLog_msg_23;
  undefined1 local_2e48 [8];
  string nl;
  long cnt;
  undefined1 local_2e00 [8];
  ostringstream cmCTestLog_msg_22;
  long local_2c88;
  ifstream ifile;
  string local_2a80 [32];
  undefined1 local_2a60 [8];
  ostringstream cmCTestLog_msg_21;
  SingleFileCoverageVector *vec;
  undefined1 local_28c0 [8];
  ostringstream cmCTestLog_msg_20;
  string local_2748 [32];
  undefined1 local_2728 [8];
  ostringstream cmCTestLog_msg_19;
  string local_25b0 [32];
  undefined1 local_2590 [8];
  ostringstream cmCTestLog_msg_18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2418;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2410;
  iterator t;
  string local_23e8 [32];
  undefined1 local_23c8 [8];
  ostringstream cmCTestLog_msg_17;
  undefined1 local_2248 [4];
  int success;
  string srcname;
  undefined1 local_2208 [8];
  ostringstream cmCTestLog_msg_16;
  long local_2090;
  ifstream srcead;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e80;
  iterator a;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e60;
  const_iterator local_1e58;
  string local_1e50 [32];
  undefined1 local_1e30 [8];
  ostringstream cmCTestLog_msg_15;
  undefined1 local_1cb8 [8];
  string daGlob;
  undefined1 local_1c78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string dir;
  Glob gl;
  string lcovFile;
  string sourceFile;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b98;
  iterator line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  undefined1 local_1b58 [8];
  ostringstream cmCTestLog_msg_14;
  string local_19e0 [32];
  undefined1 local_19c0 [8];
  ostringstream cmCTestLog_msg_13;
  string local_1848 [32];
  undefined1 local_1828 [8];
  ostringstream cmCTestLog_msg_12;
  string local_16b0 [32];
  undefined1 local_1690 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1518 [32];
  undefined1 local_14f8 [8];
  ostringstream cmCTestLog_msg_10;
  int local_137c;
  int res;
  int retVal;
  string errors;
  string output;
  undefined1 local_1318 [8];
  ostringstream cmCTestLog_msg_9;
  string local_11a0 [32];
  undefined1 local_1180 [8];
  ostringstream cmCTestLog_msg_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  undefined1 local_fa8 [8];
  string command;
  cmWorkingDirectory workdir;
  string fileDir;
  undefined1 local_f28 [8];
  ostringstream cmCTestLog_msg_7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_da8;
  undefined1 local_da0 [8];
  cmCTestCoverageHandlerLocale locale_C;
  string local_d78 [4];
  int file_count;
  undefined1 local_d58 [8];
  ostringstream cmCTestLog_msg_6;
  string local_be0 [32];
  undefined1 local_bc0 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_a48 [8];
  string actualSourceFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  string testingDir;
  undefined1 local_9b8 [8];
  ostringstream cmCTestLog_msg_4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_840;
  iterator it;
  undefined1 local_818 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_6a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_668 [8];
  ostringstream cmCTestLog_msg_2;
  string local_4f0 [32];
  undefined1 local_4d0 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_358 [8];
  RegularExpression st2re3;
  string local_280 [8];
  string st2lcovOutputRex3;
  string local_258 [32];
  undefined1 local_238 [8];
  ostringstream cmCTestLog_msg;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string lcovExtraFlags;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string lcovCommand;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  lcovCommand.field_2._8_8_ = cont;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CoverageCommand",&local_61);
  cmCTest::GetCTestConfiguration((string *)local_40,pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"CoverageExtraFlags",&local_b9);
  cmCTest::GetCTestConfiguration((string *)local_98,pcVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"codecov");
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    poVar6 = std::operator<<((ostream *)local_238," Not a valid Intel Coverage command.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x51f,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    this_local._4_4_ = 0;
    st2lcovOutputRex3.field_2._12_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"[0-9]+%",(allocator *)((long)&st2re3.searchstring + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&st2re3.searchstring + 7));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::RegularExpression((RegularExpression *)local_358,pcVar5);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
    poVar6 = std::operator<<((ostream *)local_4d0," This is coverage command: ");
    poVar6 = std::operator<<(poVar6,(string *)local_40);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x528,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_4f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
    poVar6 = std::operator<<((ostream *)local_668," These are coverage command flags: ");
    poVar6 = std::operator<<(poVar6,(string *)local_98);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x52d,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string
              ((string *)
               &files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_6a0);
    bVar3 = FindLCovFiles(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_6a0);
    if (bVar3) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&local_840);
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6a0);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b8);
        poVar6 = std::operator<<((ostream *)local_9b8," Cannot find any LCov coverage files.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x53a,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(testingDir.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b8);
        this_local._4_4_ = 0;
        st2lcovOutputRex3.field_2._12_4_ = 1;
      }
      else {
        cmCTest::GetBinaryDir_abi_cxx11_
                  ((string *)&missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (this->super_cmCTestGenericHandler).CTest);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&actualSourceFile.field_2 + 8));
        std::__cxx11::string::string((string *)local_a48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bc0);
        poVar6 = std::operator<<((ostream *)local_bc0,
                                 "   Processing coverage (each . represents one file):");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x546,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_be0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bc0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d58);
        std::operator<<((ostream *)local_d58,"    ");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x547,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_d78);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d58);
        locale_C.lc_all.field_2._12_4_ = 0;
        cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale
                  ((cmCTestCoverageHandlerLocale *)local_da0);
        local_da8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6a0);
        local_840._M_current = local_da8;
        while( true ) {
          local_db0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_6a0);
          bVar3 = __gnu_cxx::operator!=(&local_840,&local_db0);
          if (!bVar3) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f28);
          poVar6 = std::operator<<((ostream *)local_f28,".");
          std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x552,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)(fileDir.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f28);
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_840);
          cmsys::SystemTools::GetFilenamePath((string *)((long)&workdir.OldDir.field_2 + 8),pbVar7);
          cmWorkingDirectory::cmWorkingDirectory
                    ((cmWorkingDirectory *)((long)&command.field_2 + 8),
                     (string *)((long)&workdir.OldDir.field_2 + 8));
          std::operator+(&local_1008,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::operator+(&local_fe8,&local_1008,"\" ");
          std::operator+(&local_fc8,&local_fe8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_fa8,&local_fc8," ");
          std::__cxx11::string::~string((string *)&local_fc8);
          std::__cxx11::string::~string((string *)&local_fe8);
          std::__cxx11::string::~string((string *)&local_1008);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1180);
          poVar6 = std::operator<<((ostream *)local_1180,"Current coverage dir: ");
          poVar6 = std::operator<<(poVar6,(string *)(workdir.OldDir.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x559,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_11a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1180);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1318);
          poVar6 = std::operator<<((ostream *)local_1318,(string *)local_fa8);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x55b,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1318);
          std::__cxx11::string::string((string *)(errors.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&res);
          local_137c = 0;
          poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),
                                   "* Run coverage for: ");
          poVar6 = std::operator<<(poVar6,(string *)(workdir.OldDir.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Command: ");
          poVar6 = std::operator<<(poVar6,(string *)local_fa8);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          dir_00 = (char *)std::__cxx11::string::c_str();
          bVar3 = cmCTest::RunCommand(pcVar1,pcVar5,(string *)((long)&errors.field_2 + 8),
                                      (string *)&res,&local_137c,dir_00,0.0,Auto);
          poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Output: ");
          poVar6 = std::operator<<(poVar6,(string *)(errors.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Errors: ");
          poVar6 = std::operator<<(poVar6,(string *)&res);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          if (bVar3) {
            if (local_137c != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1828);
              poVar6 = std::operator<<((ostream *)local_1828,"Coverage command returned: ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_137c);
              poVar6 = std::operator<<(poVar6," while processing: ");
              pbVar7 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_840);
              poVar6 = std::operator<<(poVar6,(string *)pbVar7);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,6,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x572,pcVar5,false);
              std::__cxx11::string::~string(local_1848);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1828);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19c0);
              poVar6 = std::operator<<((ostream *)local_19c0,"Command produced error: ");
              pvVar8 = (void *)std::ostream::operator<<(poVar6,*(int *)lcovCommand.field_2._8_8_);
              std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,6,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x574,pcVar5,false);
              std::__cxx11::string::~string(local_19e0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19c0);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b58);
            poVar6 = std::operator<<((ostream *)local_1b58,
                                     "--------------------------------------------------------------"
                                    );
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(poVar6,(string *)(errors.field_2._M_local_buf + 8));
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(poVar6,
                                     "--------------------------------------------------------------"
                                    );
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x57d,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string
                      ((string *)
                       &lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b58);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&line);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::__normal_iterator(&local_1b98);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Split
                      (pcVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&line);
            local_1b98._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&line);
            while( true ) {
              sourceFile.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&line);
              bVar3 = __gnu_cxx::operator!=
                                (&local_1b98,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&sourceFile.field_2 + 8));
              if (!bVar3) break;
              std::__cxx11::string::string((string *)(lcovFile.field_2._M_local_buf + 8));
              std::__cxx11::string::string((string *)&gl.ListDirs);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_1b98);
              std::__cxx11::string::empty();
              cmsys::Glob::Glob((Glob *)((long)&dir.field_2 + 8));
              cmsys::Glob::RecurseOn((Glob *)((long)&dir.field_2 + 8));
              cmsys::Glob::RecurseThroughSymlinksOff((Glob *)((long)&dir.field_2 + 8));
              std::__cxx11::string::string
                        ((string *)
                         &lcovFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1c78);
              cmCTest::GetBinaryDir_abi_cxx11_
                        ((string *)((long)&daGlob.field_2 + 8),
                         (this->super_cmCTestGenericHandler).CTest);
              this_00 = &lcovFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::operator=
                        ((string *)this_00,(string *)(daGlob.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(daGlob.field_2._M_local_buf + 8));
              std::__cxx11::string::string((string *)local_1cb8);
              std::__cxx11::string::operator=((string *)local_1cb8,(string *)this_00);
              std::__cxx11::string::operator+=((string *)local_1cb8,"/*.LCOV");
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e30);
              poVar6 = std::operator<<((ostream *)local_1e30,"   looking for LCOV files in: ");
              poVar6 = std::operator<<(poVar6,(string *)local_1cb8);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x599,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_1e50);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e30);
              cmsys::Glob::FindFiles
                        ((Glob *)((long)&dir.field_2 + 8),(string *)local_1cb8,(GlobMessages *)0x0);
              local_1e60._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1c78);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&local_1e58,&local_1e60);
              pvVar9 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&dir.field_2 + 8));
              __first = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::begin(pvVar9);
              pvVar9 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&dir.field_2 + 8));
              __last = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(pvVar9);
              a = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_1c78,local_1e58,__first._M_current,__last._M_current);
              local_1e80._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c78);
              while( true ) {
                local_1e88._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c78);
                bVar3 = __gnu_cxx::operator!=(&local_1e80,&local_1e88);
                if (!bVar3) break;
                pbVar7 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_1e80);
                std::__cxx11::string::operator=((string *)&gl.ListDirs,(string *)pbVar7);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                std::ifstream::ifstream(&local_2090,pcVar5,_S_in);
                bVar4 = std::ios::operator!((ios *)((long)&local_2090 +
                                                   *(long *)(local_2090 + -0x18)));
                if ((bVar4 & 1) != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2208);
                  poVar6 = std::operator<<((ostream *)local_2208,"Cannot open file: ");
                  poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,6,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5a5,pcVar5,false);
                  std::__cxx11::string::~string((string *)(srcname.field_2._M_local_buf + 8));
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2208);
                }
                std::__cxx11::string::string((string *)local_2248);
                bVar3 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&local_2090,(string *)local_2248,(bool *)0x0,-1);
                if (bVar3) {
                  std::__cxx11::string::substr((ulong)&t,(ulong)local_2248);
                  std::__cxx11::string::operator=((string *)local_2248,(string *)&t);
                  std::__cxx11::string::~string((string *)&t);
                  std::__cxx11::string::operator=
                            ((string *)(lcovFile.field_2._M_local_buf + 8),(string *)local_2248);
                  std::__cxx11::string::operator=((string *)local_a48,(string *)local_2248);
                  local_2410._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1c78);
                  while( true ) {
                    local_2418._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1c78);
                    bVar3 = __gnu_cxx::operator!=(&local_2410,&local_2418);
                    if (!bVar3) break;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2590);
                    poVar6 = std::operator<<((ostream *)local_2590,"Found LCOV File: ");
                    pbVar7 = __gnu_cxx::
                             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_2410);
                    poVar6 = std::operator<<(poVar6,(string *)pbVar7);
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5bb,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1)
                                );
                    std::__cxx11::string::~string(local_25b0);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2590);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&local_2410);
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2728);
                  poVar6 = std::operator<<((ostream *)local_2728,"SourceFile: ");
                  poVar6 = std::operator<<(poVar6,(string *)(lcovFile.field_2._M_local_buf + 8));
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5bf,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                  std::__cxx11::string::~string(local_2748);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2728);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_28c0);
                  poVar6 = std::operator<<((ostream *)local_28c0,"lCovFile: ");
                  poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5c1,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                  std::__cxx11::string::~string((string *)&vec);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_28c0);
                  uVar10 = std::__cxx11::string::empty();
                  if (((uVar10 & 1) == 0) &&
                     (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
                    this_01 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                            *)(lcovCommand.field_2._8_8_ + 0x48),
                                           (key_type *)local_a48);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a60);
                    poVar6 = std::operator<<((ostream *)local_2a60,"   in lcovFile: ");
                    poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5ca,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1)
                                );
                    std::__cxx11::string::~string(local_2a80);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a60);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    std::ifstream::ifstream(&local_2c88,pcVar5,_S_in);
                    bVar4 = std::ios::operator!((ios *)((long)&local_2c88 +
                                                       *(long *)(local_2c88 + -0x18)));
                    if ((bVar4 & 1) == 0) {
                      nl.field_2._8_8_ = 0xffffffffffffffff;
                      std::__cxx11::string::string((string *)local_2e48);
                      cmsys::SystemTools::GetLineFromStream
                                ((istream *)&local_2c88,(string *)local_2e48,(bool *)0x0,-1);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2fc0);
                      poVar6 = std::operator<<((ostream *)local_2fc0,"File is ready, start reading."
                                              );
                      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::ostringstream::str();
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      cmCTest::Log(pcVar1,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5d8,pcVar5,
                                   (bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                      std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2fc0);
                      while (bVar3 = cmsys::SystemTools::GetLineFromStream
                                               ((istream *)&local_2c88,(string *)local_2e48,
                                                (bool *)0x0,-1), bVar3) {
                        nl.field_2._8_8_ = nl.field_2._8_8_ + 1;
                        uVar10 = std::__cxx11::string::empty();
                        if (((uVar10 & 1) == 0) &&
                           (uVar10 = std::__cxx11::string::size(), 0xb < uVar10)) {
                          std::__cxx11::string::substr((ulong)local_3000,(ulong)local_2e48);
                          pcVar5 = (char *)std::__cxx11::string::c_str();
                          lineNumber.field_2._12_4_ = atoi(pcVar5);
                          std::__cxx11::string::substr((ulong)local_3028,(ulong)local_2e48);
                          pcVar5 = (char *)std::__cxx11::string::c_str();
                          local_302c = atoi(pcVar5);
                          local_302c = local_302c + -1;
                          if (-1 < local_302c) {
                            while (sVar13 = std::vector<int,_std::allocator<int>_>::size(this_01),
                                  sVar13 <= (ulong)(long)local_302c) {
                              local_3030 = -1;
                              std::vector<int,_std::allocator<int>_>::push_back(this_01,&local_3030)
                              ;
                            }
                            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                                (this_01,(long)local_302c);
                            if ((*pvVar11 < 0) &&
                               ((0 < (int)lineNumber.field_2._12_4_ ||
                                (lVar12 = std::__cxx11::string::find('\0',0x23), lVar12 != -1)))) {
                              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  (this_01,(long)local_302c);
                              *pvVar11 = 0;
                            }
                            uVar2 = lineNumber.field_2._12_4_;
                            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                                (this_01,(long)local_302c);
                            *pvVar11 = uVar2 + *pvVar11;
                          }
                          std::__cxx11::string::~string(local_3028);
                          std::__cxx11::string::~string(local_3000);
                        }
                      }
                      std::__cxx11::string::~string((string *)local_2e48);
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e00);
                      poVar6 = std::operator<<((ostream *)local_2e00,"Cannot open file: ");
                      poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::ostringstream::str();
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      cmCTest::Log(pcVar1,6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5cf,pcVar5,false);
                      std::__cxx11::string::~string((string *)&cnt);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e00);
                    }
                    std::__cxx11::string::operator=((string *)local_a48,"");
                    std::ifstream::~ifstream(&local_2c88);
                  }
                  st2lcovOutputRex3.field_2._12_4_ = 0;
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_23c8);
                  poVar6 = std::operator<<((ostream *)local_23c8,"Error while parsing lcov file \'")
                  ;
                  poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                  poVar6 = std::operator<<(poVar6,"\':");
                  poVar6 = std::operator<<(poVar6," No source file name found!");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::ostringstream::str();
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  cmCTest::Log(pcVar1,6,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5ae,pcVar5,false);
                  std::__cxx11::string::~string(local_23e8);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_23c8);
                  this_local._4_4_ = 0;
                  st2lcovOutputRex3.field_2._12_4_ = 1;
                }
                std::__cxx11::string::~string((string *)local_2248);
                std::ifstream::~ifstream(&local_2090);
                if (st2lcovOutputRex3.field_2._12_4_ != 0) goto LAB_005763ac;
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_1e80);
              }
              st2lcovOutputRex3.field_2._12_4_ = 0;
LAB_005763ac:
              std::__cxx11::string::~string((string *)local_1cb8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1c78);
              std::__cxx11::string::~string
                        ((string *)
                         &lcovFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cmsys::Glob::~Glob((Glob *)((long)&dir.field_2 + 8));
              std::__cxx11::string::~string((string *)&gl.ListDirs);
              std::__cxx11::string::~string((string *)(lcovFile.field_2._M_local_buf + 8));
              if (st2lcovOutputRex3.field_2._12_4_ != 0) goto LAB_005766c3;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_1b98);
            }
            locale_C.lc_all.field_2._12_4_ = locale_C.lc_all.field_2._12_4_ + 1;
            if ((int)locale_C.lc_all.field_2._12_4_ % 0x32 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_31a8);
              poVar6 = std::operator<<((ostream *)local_31a8," processed: ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,locale_C.lc_all.field_2._12_4_);
              poVar6 = std::operator<<(poVar6," out of ");
              sVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_6a0);
              pvVar8 = (void *)std::ostream::operator<<(poVar6,sVar13);
              std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x60d,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_31c8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_31a8);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3340);
              std::operator<<((ostream *)local_3340,"    ");
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x60e,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_3360);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3340);
            }
            st2lcovOutputRex3.field_2._12_4_ = 0;
LAB_005766c3:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&line);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_14f8);
            poVar6 = std::operator<<((ostream *)local_14f8,"Problem running coverage on file: ");
            pbVar7 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_840);
            poVar6 = std::operator<<(poVar6,(string *)pbVar7);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x56a,pcVar5,false);
            std::__cxx11::string::~string(local_1518);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_14f8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1690);
            poVar6 = std::operator<<((ostream *)local_1690,"Command produced error: ");
            poVar6 = std::operator<<(poVar6,(string *)&res);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x56c,pcVar5,false);
            std::__cxx11::string::~string(local_16b0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1690);
            *(int *)lcovCommand.field_2._8_8_ = *(int *)lcovCommand.field_2._8_8_ + 1;
            st2lcovOutputRex3.field_2._12_4_ = 0x12;
          }
          std::__cxx11::string::~string((string *)&res);
          std::__cxx11::string::~string((string *)(errors.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_fa8);
          cmWorkingDirectory::~cmWorkingDirectory
                    ((cmWorkingDirectory *)((long)&command.field_2 + 8));
          std::__cxx11::string::~string((string *)(workdir.OldDir.field_2._M_local_buf + 8));
          if ((st2lcovOutputRex3.field_2._12_4_ != 0) && (st2lcovOutputRex3.field_2._12_4_ != 0x12))
          goto LAB_0057679a;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_840);
        }
        this_local._4_4_ = locale_C.lc_all.field_2._12_4_;
        st2lcovOutputRex3.field_2._12_4_ = 1;
LAB_0057679a:
        cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale
                  ((cmCTestCoverageHandlerLocale *)local_da0);
        std::__cxx11::string::~string((string *)local_a48);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&actualSourceFile.field_2 + 8));
        std::__cxx11::string::~string
                  ((string *)&missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_818);
      std::operator<<((ostream *)local_818,"Error while finding LCov files.\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x532,pcVar5,false);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_818);
      this_local._4_4_ = 0;
      st2lcovOutputRex3.field_2._12_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6a0);
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_358);
    std::__cxx11::string::~string(local_280);
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }
  std::vector<std::string>::iterator it;

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (it = files.begin(); it != files.end(); ++it) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(*it);
    cmWorkingDirectory workdir(fileDir);
    std::string command = "\"" + lcovCommand + "\" " + lcovExtraFlags + " ";

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res =
      this->CTest->RunCommand(command.c_str(), &output, &errors, &retVal,
                              fileDir.c_str(), 0 /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Coverage command returned: "
                   << retVal << " while processing: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    std::vector<std::string>::iterator line;

    cmSystemTools::Split(output.c_str(), lines);

    for (line = lines.begin(); line != lines.end(); ++line) {
      std::string sourceFile;
      std::string lcovFile;

      if (line->empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      lcovFiles.insert(lcovFiles.end(), gl.GetFiles().begin(),
                       gl.GetFiles().end());

      for (std::vector<std::string>::iterator a = lcovFiles.begin();
           a != lcovFiles.end(); ++a) {
        lcovFile = *a;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::vector<std::string>::iterator t = lcovFiles.begin();
             t != lcovFiles.end(); ++t) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << *t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              cnt++;

              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile = "";
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}